

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

void __thiscall testing::internal::RE::~RE(RE *this)

{
  if (this[0x20] == (RE)0x1) {
    regfree((regex_t *)(this + 0x68));
    regfree((regex_t *)(this + 0x28));
  }
  if (*(RE **)this != this + 0x10) {
    operator_delete(*(RE **)this,*(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

RE::~RE() {
  if (is_valid_) {
    // regfree'ing an invalid regex might crash because the content
    // of the regex is undefined. Since the regex's are essentially
    // the same, one cannot be valid (or invalid) without the other
    // being so too.
    regfree(&partial_regex_);
    regfree(&full_regex_);
  }
}